

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::Next
          (CopyingOutputStreamAdaptor *this,void **data,int *size)

{
  bool bVar1;
  pointer puVar2;
  CopyingOutputStreamAdaptor *in_RDX;
  CopyingOutputStreamAdaptor *in_RSI;
  long in_RDI;
  bool local_1;
  
  if ((*(int *)(in_RDI + 0x2c) != *(int *)(in_RDI + 0x28)) || (bVar1 = WriteBuffer(in_RSI), bVar1))
  {
    AllocateBufferIfNeeded(in_RDX);
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDX
                       );
    (in_RSI->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
         (_func_int **)(puVar2 + *(int *)(in_RDI + 0x2c));
    *(int *)&(in_RDX->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
         *(int *)(in_RDI + 0x28) - *(int *)(in_RDI + 0x2c);
    *(undefined4 *)(in_RDI + 0x2c) = *(undefined4 *)(in_RDI + 0x28);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CopyingOutputStreamAdaptor::Next(void** data, int* size) {
  if (buffer_used_ == buffer_size_) {
    if (!WriteBuffer()) return false;
  }

  AllocateBufferIfNeeded();

  *data = buffer_.get() + buffer_used_;
  *size = buffer_size_ - buffer_used_;
  buffer_used_ = buffer_size_;
  return true;
}